

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_map_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  int iVar1;
  JSMapRecord *mr;
  JSValue JVar2;
  undefined1 auVar3 [16];
  JSValue *pJVar4;
  long lVar5;
  list_head *plVar6;
  JSValueUnion *pJVar7;
  ulong uVar8;
  JSValue JVar9;
  JSValue JVar10;
  ulong uStack_60;
  JSValue args [2];
  
  pJVar4 = (JSValue *)JS_GetOpaque2(ctx,this_val,magic + 0x23);
  if (pJVar4 == (JSValue *)0x0) {
    *pdone = 0;
    uStack_60 = 6;
  }
  else {
    iVar1 = (int)pJVar4->tag;
    if (iVar1 != 3) {
      if ((iVar1 == -1) && (magic + 0x1fU == (uint)*(ushort *)((long)(pJVar4->u).ptr + 6))) {
        lVar5 = *(long *)((long)(pJVar4->u).ptr + 0x30);
      }
      else {
        lVar5 = 0;
      }
      mr = (JSMapRecord *)pJVar4[1].tag;
      if (mr == (JSMapRecord *)0x0) {
        plVar6 = *(list_head **)(lVar5 + 0x10);
      }
      else {
        plVar6 = (mr->link).next;
        map_decref_record(ctx->rt,mr);
      }
      for (; plVar6 != (list_head *)(lVar5 + 8); plVar6 = plVar6->next) {
        if (*(int *)((long)&plVar6[-2].next + 4) == 0) {
          *(int *)&plVar6[-2].next = *(int *)&plVar6[-2].next + 1;
          pJVar4[1].tag = (int64_t)&plVar6[-2].next;
          *pdone = 0;
          if (pJVar4[1].u.int32 == 0) {
            args[1].u = (JSValueUnion)((JSValueUnion *)(plVar6 + 2))->ptr;
            args[1].tag = (int64_t)plVar6[2].next;
LAB_0013bdd7:
            JVar2.tag = args[1].tag;
            JVar2.u.ptr = args[1].u.ptr;
            JVar10.tag = args[1].tag;
            JVar10.u.ptr = args[1].u.ptr;
            if (0xfffffff4 < (uint)args[1].tag) {
              *(int *)args[1].u.ptr = *args[1].u.ptr + 1;
              JVar10 = JVar2;
            }
          }
          else {
            args[0].u = *(JSValueUnion *)(plVar6 + 2);
            args[0].tag = (int64_t)plVar6[2].next;
            pJVar7 = (JSValueUnion *)(plVar6 + 3);
            if (magic != 0) {
              pJVar7 = (JSValueUnion *)(plVar6 + 2);
            }
            args[1].u = (JSValueUnion)pJVar7->ptr;
            args[1].tag = *(int64_t *)(pJVar7 + 1);
            if (pJVar4[1].u.int32 == 1) goto LAB_0013bdd7;
            JVar10 = js_create_array(ctx,2,args);
          }
          uVar8 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
          goto LAB_0013bd66;
        }
      }
      pJVar4[1].tag = 0;
      JS_FreeValue(ctx,*pJVar4);
      (pJVar4->u).int32 = 0;
      pJVar4->tag = 3;
    }
    *pdone = 1;
    uStack_60 = 3;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_60;
  JVar10 = (JSValue)(auVar3 << 0x40);
  uVar8 = 0;
LAB_0013bd66:
  JVar9.tag = JVar10.tag;
  JVar9.u.ptr = (void *)((ulong)JVar10.u.ptr & 0xffffffff | uVar8);
  return JVar9;
}

Assistant:

static JSValue js_map_iterator_next(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv,
                                    BOOL *pdone, int magic)
{
    JSMapIteratorData *it;
    JSMapState *s;
    JSMapRecord *mr;
    struct list_head *el;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP_ITERATOR + magic);
    if (!it) {
        *pdone = FALSE;
        return JS_EXCEPTION;
    }
    if (JS_IsUndefined(it->obj))
        goto done;
    s = JS_GetOpaque(it->obj, JS_CLASS_MAP + magic);
    assert(s != NULL);
    if (!it->cur_record) {
        el = s->records.next;
    } else {
        mr = it->cur_record;
        el = mr->link.next;
        map_decref_record(ctx->rt, mr); /* the record can be freed here */
    }
    for(;;) {
        if (el == &s->records) {
            /* no more record  */
            it->cur_record = NULL;
            JS_FreeValue(ctx, it->obj);
            it->obj = JS_UNDEFINED;
        done:
            /* end of enumeration */
            *pdone = TRUE;
            return JS_UNDEFINED;
        }
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty)
            break;
        /* get the next record */
        el = mr->link.next;
    }

    /* lock the record so that it won't be freed */
    mr->ref_count++;
    it->cur_record = mr;
    *pdone = FALSE;

    if (it->kind == JS_ITERATOR_KIND_KEY) {
        return JS_DupValue(ctx, mr->key);
    } else {
        JSValueConst args[2];
        args[0] = mr->key;
        if (magic)
            args[1] = mr->key;
        else
            args[1] = mr->value;
        if (it->kind == JS_ITERATOR_KIND_VALUE) {
            return JS_DupValue(ctx, args[1]);
        } else {
            return js_create_array(ctx, 2, args);
        }
    }
}